

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

void __thiscall xray_re::xr_ogf_v3::load_kinematics(xr_ogf_v3 *this,xr_reader *r)

{
  byte *pbVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  xr_bone *pxVar14;
  int iVar15;
  xr_reader *this_00;
  size_t sVar16;
  pointer ppxVar17;
  undefined4 extraout_var;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  xr_reader *s;
  xr_reader *local_20;
  long lVar18;
  
  load_hierrarhy_visual(this,r);
  this_00 = xr_reader::open_chunk(r,0x18);
  local_20 = this_00;
  if (this_00 != (xr_reader *)0x0) {
    xr_reader::r_sz(this_00,&(this->super_xr_ogf).super_xr_object.m_userdata);
    pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 3);
    *pbVar1 = *pbVar1 | 1;
    if (this_00->m_end < (this_00->field_2).m_p) goto LAB_0017fcf6;
    if ((this_00->field_2).m_p != this_00->m_end) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x372,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
    }
    xr_reader::close_chunk(r,&local_20);
  }
  sVar16 = xr_reader::find_chunk(r,0xd);
  if (sVar16 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                  ,0x377,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
  }
  load_s_bone_names(this,r);
  local_20 = xr_reader::open_chunk(r,0x1c);
  if (local_20 == (xr_reader *)0x0) {
    local_20 = xr_reader::open_chunk(r,0x19);
    if (local_20 == (xr_reader *)0x0) {
      local_20 = xr_reader::open_chunk(r,0x17);
      if (local_20 == (xr_reader *)0x0) goto LAB_0017fbcd;
      load_s_ikdata_0(this,local_20);
      if (local_20->m_end < (local_20->field_2).m_p) goto LAB_0017fcf6;
      if ((local_20->field_2).m_p != local_20->m_end) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x38a,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
      }
    }
    else {
      load_s_ikdata(this,local_20);
      if (local_20->m_end < (local_20->field_2).m_p) goto LAB_0017fcf6;
      if ((local_20->field_2).m_p != local_20->m_end) {
        __assert_fail("s->eof()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,900,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
      }
    }
  }
  else {
    load_s_ikdata_2(this,local_20);
    if (local_20->m_end < (local_20->field_2).m_p) {
LAB_0017fcf6:
      __assert_fail("m_p <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                    ,0x7e,"bool xray_re::xr_reader::eof() const");
    }
    if ((local_20->field_2).m_p != local_20->m_end) {
      __assert_fail("s->eof()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                    ,0x37e,"void xray_re::xr_ogf_v3::load_kinematics(xr_reader &)");
    }
  }
  xr_reader::close_chunk(r,&local_20);
LAB_0017fbcd:
  xr_object::calculate_bind((xr_object *)this);
  ppxVar17 = (this->super_xr_ogf).m_children.
             super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->super_xr_ogf).m_children.
      super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppxVar17) {
    lVar22 = 0;
    do {
      iVar15 = (*(ppxVar17[lVar22]->super_xr_object).super_xr_surface_factory.
                 _vptr_xr_surface_factory[0x1f])();
      lVar18 = CONCAT44(extraout_var,iVar15);
      if (*(long *)(lVar18 + 0x10) != 0) {
        lVar19 = 8;
        lVar20 = 0;
        lVar21 = 0;
        do {
          lVar13 = *(long *)(lVar18 + 0x20);
          pxVar14 = (this->super_xr_ogf).super_xr_object.m_bones.
                    super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>.
                    _M_impl.super__Vector_impl_data._M_start
                    [*(int *)(*(long *)(lVar18 + 0x40) + lVar20)];
          fVar2 = *(float *)(lVar13 + -8 + lVar19);
          fVar3 = *(float *)(lVar13 + -4 + lVar19);
          fVar4 = *(float *)(lVar13 + lVar19);
          fVar5 = (pxVar14->m_bind_xform).field_0.field_0._13;
          fVar6 = (pxVar14->m_bind_xform).field_0.field_0._43;
          fVar7 = (pxVar14->m_bind_xform).field_0.field_0._23;
          fVar8 = (pxVar14->m_bind_xform).field_0.field_0._33;
          uVar9 = *(undefined8 *)&(pxVar14->m_bind_xform).field_0;
          uVar10 = *(undefined8 *)((long)&(pxVar14->m_bind_xform).field_0 + 0x10);
          uVar11 = *(undefined8 *)((long)&(pxVar14->m_bind_xform).field_0 + 0x20);
          uVar12 = *(undefined8 *)((long)&(pxVar14->m_bind_xform).field_0 + 0x30);
          *(ulong *)(lVar13 + -8 + lVar19) =
               CONCAT44(fVar4 * (float)((ulong)uVar11 >> 0x20) +
                        fVar3 * (float)((ulong)uVar10 >> 0x20) +
                        fVar2 * (float)((ulong)uVar9 >> 0x20) + (float)((ulong)uVar12 >> 0x20),
                        fVar4 * (float)uVar11 +
                        fVar3 * (float)uVar10 + fVar2 * (float)uVar9 + (float)uVar12);
          *(float *)(lVar13 + lVar19) = fVar8 * fVar4 + fVar7 * fVar3 + fVar5 * fVar2 + fVar6;
          lVar21 = lVar21 + 1;
          lVar19 = lVar19 + 0xc;
          lVar20 = lVar20 + 0x24;
        } while (lVar21 != *(long *)(lVar18 + 0x10));
      }
      lVar22 = lVar22 + 1;
      ppxVar17 = (this->super_xr_ogf).m_children.
                 super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    } while (lVar22 != (long)(this->super_xr_ogf).m_children.
                             super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppxVar17 >> 3);
  }
  return;
}

Assistant:

void xr_ogf_v3::load_kinematics(xr_reader& r)
{
	load_hierrarhy_visual(r);

	xr_reader* s = r.open_chunk(OGF3_S_USERDATA);
	if (s) {
		load_s_userdata(*s);
		assert(s->eof());
		r.close_chunk(s);
	}

	if (!r.find_chunk(OGF3_S_BONE_NAMES))
		xr_not_expected();
	load_s_bone_names(r);
	r.debug_find_chunk();

	s = r.open_chunk(OGF3_S_IKDATA_2);
	if (s) {
		load_s_ikdata_2(*s);
		xr_assert(s->eof());
		r.close_chunk(s);
	} else {
		s = r.open_chunk(OGF3_S_IKDATA);
		if (s) {
			load_s_ikdata(*s);
			xr_assert(s->eof());
			r.close_chunk(s);
		} else {
			s = r.open_chunk(OGF3_S_IKDATA_0);
			if (s) {
				load_s_ikdata_0(*s);
				xr_assert(s->eof());
				r.close_chunk(s);
			}
		}
	}

	//��������� ���������� ������ �� ������� ������������ ����� � ������� ������������ ������
	//������ ������� ������ ��� ��������
	calculate_bind();
	for(size_t j = 0; j!= children().size(); ++j)
	{
		const xr_vbuf & vb = children()[j]->vb();
		for (size_t i = 0; i != vb.size(); ++i)
		{
			const finfluence * weights =  vb.w() + i;
			int bone = weights->array[0].bone;
			fvector3 * pv = const_cast<fvector3 *>(vb.p() + i);
			const fmatrix& xform = bones()[bone]->bind_xform(); 
			fvector3 temp;
			temp.transform(*pv, xform);
			*pv = temp;
		}
	}
}